

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPandVC.cpp
# Opt level: O1

void * Thread1_IO(void *arg)

{
  sockaddr *__addr;
  uint uVar1;
  char cVar2;
  undefined8 *puVar3;
  char *pcVar4;
  bool bVar5;
  bool bVar6;
  char c;
  char character;
  int vEnd;
  int vStart;
  uint ver2;
  uint ver1;
  uint vertexMaxNum;
  Edgetype Edges;
  string line;
  string edgesString;
  istringstream input;
  istringstream EInput;
  char local_42a;
  char local_429;
  Graph *local_428;
  uint local_420;
  uint local_41c;
  int local_418;
  uint local_414;
  uint local_410;
  uint local_40c;
  vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
  local_408;
  undefined8 local_3e8;
  undefined1 *local_3e0;
  undefined8 local_3d8;
  undefined1 local_3d0 [24];
  undefined1 *local_3b8;
  undefined8 local_3b0;
  undefined1 local_3a8 [16];
  vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
  local_398;
  undefined1 local_378 [72];
  long local_330 [4];
  uint auStack_310 [22];
  ios_base local_2b8 [264];
  istringstream local_1b0 [120];
  ios_base local_138 [264];
  
  local_3b8 = local_3a8;
  local_3b0 = 0;
  local_3a8[0] = 0;
  local_41c = 0;
  local_420 = 0;
  local_3e8 = 0;
  if ((*(int *)((long)arg + 0x9c) != 0) && (*(int *)((long)arg + 0x98) != 0)) {
    countVec = 0;
    Graph::printVC((Graph *)arg);
  }
  local_418 = 0;
  local_428 = (Graph *)arg;
  do {
    local_3e0 = local_3d0;
    local_3d8 = 0;
    local_3d0[0] = 0;
    cVar2 = std::ios::widen((char)*(undefined8 *)(std::cin + -0x18) + '0');
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)&local_3e0,cVar2);
    std::__cxx11::istringstream::istringstream
              ((istringstream *)local_330,(string *)&local_3e0,_S_in);
    local_408.
    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.
    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408.
    super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (((byte)__cxa_pure_virtual[*(long *)(std::cin + -0x18)] & 2) != 0) {
      exit(0);
    }
    do {
      if ((*(byte *)((long)auStack_310 + *(long *)(local_330[0] + -0x18)) & 2) != 0) break;
      std::operator>>((istream *)local_330,&local_429);
      uVar1 = *(uint *)((long)auStack_310 + *(long *)(local_330[0] + -0x18));
      if ((uVar1 & 5) == 0) {
        if (local_429 == 'E') {
          std::operator>>((istream *)local_330,(string *)&local_3b8);
          std::__cxx11::istringstream::istringstream(local_1b0,(string *)&local_3b8,_S_in);
          std::operator>>((istream *)local_1b0,&local_42a);
          while (local_42a != '}') {
            std::operator>>((istream *)local_1b0,&local_42a);
            if (local_42a == '}') goto LAB_00109eff;
            std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
            std::operator>>((istream *)local_1b0,&local_42a);
            std::istream::_M_extract<unsigned_int>((uint *)local_1b0);
            std::operator>>((istream *)local_1b0,&local_42a);
            std::operator>>((istream *)local_1b0,&local_42a);
            if ((local_428->maxVertex <= local_414) || (local_428->maxVertex <= local_410)) {
              puVar3 = (undefined8 *)__cxa_allocate_exception(8);
              *puVar3 = "Point order out of range.";
              __cxa_throw(puVar3,&char_const*::typeinfo,0);
            }
            __addr = (sockaddr *)(local_378 + 0x30);
            std::
            vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ::vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                      *)__addr,&local_408);
            Graph::connect((Graph *)local_378,(int)local_428,__addr,local_410);
            local_398.
            super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 local_408.
                 super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
            local_398.
            super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish =
                 local_408.
                 super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
            local_398.
            super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start =
                 local_408.
                 super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
            local_408.
            super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)local_378._0_8_;
            local_408.
            super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)local_378._8_8_;
            local_408.
            super__Vector_base<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)local_378._16_8_;
            local_378._0_8_ = (pointer)0x0;
            local_378._8_8_ = (pointer)0x0;
            local_378._16_8_ = (pointer)0x0;
            std::
            vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ::~vector(&local_398);
            std::
            vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                       *)local_378);
            std::
            vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
            ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                       *)__addr);
          }
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                    *)(local_378 + 0x18),&local_408);
          Graph::setEdges(local_428,
                          (vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                           *)(local_378 + 0x18));
          std::
          vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
          ::~vector((vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
                     *)(local_378 + 0x18));
          local_3e8 = 1;
LAB_00109eff:
          local_428->EEmpFlag = 1;
          std::__cxx11::istringstream::~istringstream(local_1b0);
          std::ios_base::~ios_base(local_138);
        }
        else if (local_429 == 's') {
          std::istream::operator>>((istream *)local_330,(int *)&local_41c);
          std::istream::operator>>((istream *)local_330,(int *)&local_420);
          pcVar4 = "Point order out of range.";
          if ((local_428->maxVertex <= local_420) ||
             (pcVar4 = "Point order out of range.", local_428->maxVertex <= local_41c)) {
LAB_00109f59:
            puVar3 = (undefined8 *)__cxa_allocate_exception(8);
            *puVar3 = pcVar4;
            __cxa_throw(puVar3,&char_const*::typeinfo,0);
          }
          Graph::BFS(local_428,local_41c);
          Graph::printResult(local_428,local_41c,local_420);
        }
        else if (local_429 == 'V') {
          std::istream::_M_extract<unsigned_int>((uint *)local_330);
          pcVar4 = "vertexMaxNum should be an unsigned integar.";
          if ((*(byte *)((long)auStack_310 + *(long *)(local_330[0] + -0x18)) & 5) != 0)
          goto LAB_00109f59;
          Graph::setVertices(local_428,local_40c);
          local_428->VEmpFlag = 1;
          local_418 = 1;
        }
      }
    } while ((uVar1 & 5) == 0);
    bVar5 = local_418 != 0;
    bVar6 = (int)local_3e8 != 0;
    std::
    vector<std::vector<V_*,_std::allocator<V_*>_>,_std::allocator<std::vector<V_*,_std::allocator<V_*>_>_>_>
    ::~vector(&local_408);
    std::__cxx11::istringstream::~istringstream((istringstream *)local_330);
    std::ios_base::~ios_base(local_2b8);
    if (local_3e0 != local_3d0) {
      operator_delete(local_3e0);
    }
    if (bVar5 && bVar6) {
      if (local_3b8 != local_3a8) {
        operator_delete(local_3b8);
      }
      return (void *)0x0;
    }
  } while( true );
}

Assistant:

void *Thread1_IO(void *arg)
{
    struct thread_val* p = (struct thread_val*) arg;

    // Variables definition
    char cmd = '0';
    unsigned vertexMaxNum;
    std::string edgesString;
    int VcmdFlag = 0;
    int EcmdFlag = 0;
    int VEflag = 0;
    int vStart = 0;
    int vEnd = 0;

    // output
    if(!p->Database.isEmpty())
    {
        while(true)
        {
            if(countVec == 3)
            {
                countVec = 0;
                break;
            }
        }
        p->Database.printVC();
    }
    // input
    while(VEflag == 0)
    {
        // read a line of input until EOL and store in a string
        std::string line;
        std::getline(std::cin, line);
        std::istringstream input(line);

        Edgetype Edges;
        if(std::cin.eof())
        {
            exit(0);
        }
        // while there are characters in the input line
        while (!input.eof()) 
        {
            // read the first character
            char character;
            input >> character;
            if (input.fail())
            {
                break;
            }
            else
            {
                cmd = character;
            }
            try
            {
                switch(cmd)
                {
                    case 'V':
                        input >> vertexMaxNum;
                        if(input.fail())
                        {
                            throw "vertexMaxNum should be an unsigned integar.";
                            break;
                        }
                        p->Database.setVertices(vertexMaxNum);
                        VcmdFlag = 1;
                        p->Database.VEmpFlag = 1;
                        break;
                    case 'E':
                        {
                            input >> edgesString;

                            std::istringstream EInput(edgesString);
                            char c;
                            unsigned ver1,ver2;
                            int breakFlag = 0;

                            EInput >> c;// read '{'

                            while(c != '}')
                            {
                                EInput >> c;// read '<'
                                if(c!='}')
                                {
                                    EInput >> ver1;// read the first vertex
                                    EInput >> c;// read ','
                                    EInput >> ver2;// read the second vertex
                                    EInput >> c;// read '>'
                                    EInput >> c;// read ',' or '}'

                                    //to determine whether the point order is out of range
                                    if(p->Database.isOutOfRange(ver1,ver2))
                                    {
                                        throw "Point order out of range.";
                                        break;
                                    }

                                    Edges = p->Database.connect(Edges,ver1,ver2);
                                }
                                else
                                {
                                    breakFlag = 1;
                                    break;
                                }
                            }
                            if(breakFlag == 1)
                            {
                                p->Database.EEmpFlag = 1;
                                break;
                            }
                            p->Database.setEdges(Edges);
                            EcmdFlag = 1;
                            p->Database.EEmpFlag = 1;
                            break;
                        }
                        case 's':
                        {
                            input >> vStart ;
                            input >> vEnd;
                            //to determine whether the point order is out of range
                            if(p->Database.isOutOfRange(vStart,vEnd))
                            {
                                throw "Point order out of range.";
                                break;
                            }
                            p->Database.BFS(vStart);
                            p->Database.printResult(vStart,vEnd);
                            break;
                        }    
                    default:
                        break;
                }
            }
            catch(const char* msg)
            {
                std::cerr<< "Error: " << msg << std::endl;
            }
            catch(...)
            {
                std::cerr<< "Error: error happens in other cases."<<std::endl;
            }
        }

        // if read V and E
        if(VcmdFlag && EcmdFlag)
        {
            VEflag = 1;
        }
    }
    return NULL;
}